

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O0

ion_status_t sl_delete(ion_skiplist_t *skiplist,ion_key_t key)

{
  ion_key_size_t iVar1;
  sl_node *__ptr;
  sl_node *psVar2;
  ion_sl_node_t *piVar3;
  char cVar4;
  bool bVar5;
  ion_sl_node_t *jump;
  ion_sl_level_t link_h;
  ion_sl_node_t *relink;
  ion_sl_node_t *tofree;
  ion_sl_node_t *oldcursor;
  sl_node *psStack_38;
  ion_sl_level_t h;
  ion_sl_node_t *cursor;
  ion_key_size_t key_size;
  ion_key_t key_local;
  ion_skiplist_t *skiplist_local;
  ion_status_t status;
  
  iVar1 = (skiplist->super).record.key_size;
  skiplist_local = (ion_skiplist_t *)CONCAT71((uint7)cursor._5_3_,1);
  psStack_38 = skiplist->head;
  for (oldcursor._4_4_ = skiplist->head->height; -1 < oldcursor._4_4_;
      oldcursor._4_4_ = oldcursor._4_4_ + -1) {
    while( true ) {
      piVar3 = psStack_38;
      bVar5 = false;
      if (psStack_38->next[oldcursor._4_4_] != (sl_node *)0x0) {
        cVar4 = (*(skiplist->super).compare)(psStack_38->next[oldcursor._4_4_]->key,key,iVar1);
        bVar5 = cVar4 < '\0';
      }
      if (!bVar5) break;
      psStack_38 = psStack_38->next[oldcursor._4_4_];
    }
    if ((psStack_38->next[oldcursor._4_4_] != (sl_node *)0x0) &&
       (cVar4 = (*(skiplist->super).compare)(psStack_38->next[oldcursor._4_4_]->key,key,iVar1),
       cVar4 == '\0')) {
      while( true ) {
        bVar5 = false;
        if (piVar3->next[oldcursor._4_4_] != (sl_node *)0x0) {
          cVar4 = (*(skiplist->super).compare)(piVar3->next[oldcursor._4_4_]->key,key,iVar1);
          bVar5 = cVar4 == '\0';
        }
        if (!bVar5) break;
        __ptr = piVar3->next[oldcursor._4_4_];
        psVar2 = piVar3->next[oldcursor._4_4_];
        psStack_38 = piVar3;
        for (jump._4_4_ = psVar2->height; -1 < jump._4_4_; jump._4_4_ = jump._4_4_ + -1) {
          while (psStack_38->next[jump._4_4_] != psVar2) {
            psStack_38 = psStack_38->next[jump._4_4_];
          }
          psStack_38->next[jump._4_4_] = psVar2->next[jump._4_4_];
        }
        free(__ptr->key);
        free(__ptr->value);
        free(__ptr->next);
        free(__ptr);
        skiplist_local = (ion_skiplist_t *)CONCAT44(skiplist_local._4_4_ + 1,skiplist_local._0_4_);
      }
      skiplist_local = (ion_skiplist_t *)((ulong)skiplist_local & 0xffffffffffffff00);
    }
    psStack_38 = piVar3;
  }
  return (ion_status_t)skiplist_local;
}

Assistant:

ion_status_t
sl_delete(
	ion_skiplist_t	*skiplist,
	ion_key_t		key
) {
	ion_key_size_t key_size = skiplist->super.record.key_size;
	/* Default return is no item */
	ion_status_t status;

	status			= ION_STATUS_INITIALIZE;
	/* If we fall through, then we didn't find what we were looking for. */
	status.error	= err_item_not_found;

	ion_sl_node_t	*cursor = skiplist->head;
	ion_sl_level_t	h;

	for (h = skiplist->head->height; h >= 0; --h) {
		while (NULL != cursor->next[h] && skiplist->super.compare(cursor->next[h]->key, key, key_size) < 0) {
			cursor = cursor->next[h];
		}

		if ((NULL != cursor->next[h]) && (skiplist->super.compare(cursor->next[h]->key, key, key_size) == 0)) {
			ion_sl_node_t *oldcursor = cursor;

			while (NULL != cursor->next[h] && skiplist->super.compare(cursor->next[h]->key, key, key_size) == 0) {
				ion_sl_node_t	*tofree = cursor->next[h];
				ion_sl_node_t	*relink = cursor->next[h];
				ion_sl_level_t	link_h	= relink->height;

				while (link_h >= 0) {
					while (cursor->next[link_h] != relink) {
						cursor = cursor->next[link_h];
					}

					ion_sl_node_t *jump = relink->next[link_h];

					cursor->next[link_h] = jump;
					link_h--;
				}

				free(tofree->key);
				free(tofree->value);
				free(tofree->next);
				free(tofree);

				cursor = oldcursor;
				status.count++;
			}

			status.error = err_ok;
		}
	}

	return status;
}